

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void mdisplay(double *A,int row,int col)

{
  int local_20;
  uint local_1c;
  int j;
  int i;
  int col_local;
  int row_local;
  double *A_local;
  
  printf("\n MATRIX Order : %d X %d \n \n",(ulong)(uint)row,(ulong)(uint)col);
  for (local_1c = 0; (int)local_1c < row; local_1c = local_1c + 1) {
    printf("R%d: ",(ulong)local_1c);
    for (local_20 = 0; local_20 < col; local_20 = local_20 + 1) {
      printf("%g ",A[(int)(local_1c * col + local_20)]);
    }
    printf(":R%d \n",(ulong)local_1c);
  }
  return;
}

Assistant:

void mdisplay(double *A, int row, int col) {
	int i,j;
	printf("\n MATRIX Order : %d X %d \n \n",row,col);
	
	for (i = 0; i < row; i++) {
		printf("R%d: ",i);
		for ( j = 0; j < col;j++) {
			printf("%g ",A[i*col + j]);
		}
		printf(":R%d \n",i);
	}
}